

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLutility.c
# Opt level: O0

void RDL_writeToStderr(RDL_ERROR_LEVEL level,char *fmt,...)

{
  char in_AL;
  size_t sVar1;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_48;
  undefined4 local_44;
  va_list va;
  char *specifier;
  char *new_fmt;
  uint len;
  char *fmt_local;
  RDL_ERROR_LEVEL level_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  sVar1 = strlen(fmt);
  if (level != RDL_INITIALIZE_OUTPUT) {
    if (level == RDL_DEBUG) {
      va[0].reg_save_area = anon_var_dwarf_a8b;
    }
    else if (level == RDL_WARNING) {
      va[0].reg_save_area = anon_var_dwarf_aa1;
    }
    else if (level == RDL_ERROR) {
      va[0].reg_save_area = anon_var_dwarf_ab7;
    }
    else {
      va[0].reg_save_area = anon_var_dwarf_ac1;
    }
    __s = (char *)malloc((ulong)((int)sVar1 + 0xf));
    sprintf(__s,"%12s: %s",va[0].reg_save_area,fmt);
    va[0].overflow_arg_area = local_f8;
    va[0]._0_8_ = &stack0x00000008;
    local_44 = 0x30;
    local_48 = 0x10;
    vfprintf(_stderr,__s,&local_48);
    free(__s);
  }
  return;
}

Assistant:

void RDL_writeToStderr(RDL_ERROR_LEVEL level, const char* fmt, ...)
{
  unsigned len;
  char* new_fmt;
  char* specifier;

  len = strlen(fmt);
  len += 1 + 14;

  /* we don't need any output initialization, so skip */
  if (level == RDL_INITIALIZE_OUTPUT) {
    return;
  }

  switch(level) {
    case RDL_DEBUG:
      specifier = "RDL_DEBUG";
      break;
    case RDL_WARNING:
      specifier = "RDL_WARNING";
      break;
    case RDL_ERROR:
      specifier = "RDL_ERROR";
      break;
    default:
      specifier = "RDL_????";
  }

  new_fmt = malloc(len * sizeof(*new_fmt));
  sprintf(new_fmt, "%12s: %s", specifier, fmt);

  va_list va;
  va_start(va, fmt);
  vfprintf(stderr, new_fmt, va);
  va_end(va);

  free(new_fmt);
}